

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O3

TestFunc sglr::rr_util::mapGLTestFunc(deUint32 func)

{
  TestFunc TVar1;
  
  TVar1 = TESTFUNC_LAST;
  if (func - 0x200 < 8) {
    TVar1 = *(TestFunc *)(&DAT_00672668 + (ulong)(func - 0x200) * 4);
  }
  return TVar1;
}

Assistant:

rr::TestFunc mapGLTestFunc (deUint32 func)
{
	switch (func)
	{
		case GL_ALWAYS:		return rr::TESTFUNC_ALWAYS;
		case GL_EQUAL:		return rr::TESTFUNC_EQUAL;
		case GL_GEQUAL:		return rr::TESTFUNC_GEQUAL;
		case GL_GREATER:	return rr::TESTFUNC_GREATER;
		case GL_LEQUAL:		return rr::TESTFUNC_LEQUAL;
		case GL_LESS:		return rr::TESTFUNC_LESS;
		case GL_NEVER:		return rr::TESTFUNC_NEVER;
		case GL_NOTEQUAL:	return rr::TESTFUNC_NOTEQUAL;
		default:
			DE_ASSERT(false);
			return rr::TESTFUNC_LAST;
	}
}